

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O0

void __thiscall ContainerToReaderWrapper::resetDelayedMark(ContainerToReaderWrapper *this)

{
  bool bVar1;
  reference ppVar2;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *this_00;
  reference ppVar3;
  pair<const_unsigned_int,_unsigned_int> *itr2;
  iterator __end2;
  iterator __begin2;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *__range2;
  DemuxerData *demuxerData;
  pair<const_unsigned_int,_ContainerToReaderWrapper::ReaderInfo> *itr;
  const_iterator __end1;
  const_iterator __begin1;
  map<unsigned_int,_ContainerToReaderWrapper::ReaderInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ContainerToReaderWrapper::ReaderInfo>_>_>
  *__range1;
  ContainerToReaderWrapper *this_local;
  
  __end1 = std::
           map<unsigned_int,_ContainerToReaderWrapper::ReaderInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ContainerToReaderWrapper::ReaderInfo>_>_>
           ::begin(&this->m_readerInfo);
  itr = (pair<const_unsigned_int,_ContainerToReaderWrapper::ReaderInfo> *)
        std::
        map<unsigned_int,_ContainerToReaderWrapper::ReaderInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ContainerToReaderWrapper::ReaderInfo>_>_>
        ::end(&this->m_readerInfo);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&itr);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_unsigned_int,_ContainerToReaderWrapper::ReaderInfo>_>
             ::operator*(&__end1);
    this_00 = &((ppVar2->second).m_demuxerData)->lastReadRez;
    __end2 = std::
             map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::begin(this_00);
    itr2 = (pair<const_unsigned_int,_unsigned_int> *)
           std::
           map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::end(this_00);
    while( true ) {
      bVar1 = std::operator!=(&__end2,(_Self *)&itr2);
      if (!bVar1) break;
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::operator*
                         (&__end2);
      if (ppVar3->second == 4) {
        ppVar3->second = 0;
      }
      std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>::operator++(&__end2);
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_unsigned_int,_ContainerToReaderWrapper::ReaderInfo>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void ContainerToReaderWrapper::resetDelayedMark() const
{
    for (auto& itr : m_readerInfo)
    {
        DemuxerData& demuxerData = itr.second.m_demuxerData;
        for (auto& itr2 : demuxerData.lastReadRez)
        {
            if (itr2.second == DATA_DELAYED)
                itr2.second = 0;
        }
    }
}